

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

string * __thiscall
VulkanHppGenerator::generateCommandResultSingleSuccessWithErrors
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *name,
          CommandData *commandData,size_t initialSkipCount,bool definition,bool raii)

{
  allocator<char> local_51;
  size_t local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> returnParams;
  
  local_50 = initialSkipCount;
  determineReturnParams(&returnParams,this,&commandData->params);
  switch((long)returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start >> 3) {
  case 0:
    generateCommandResultWithErrors0Return
              (__return_storage_ptr__,this,name,commandData,local_50,definition,raii);
    break;
  case 1:
    generateCommandResultSingleSuccessWithErrors1Return
              (__return_storage_ptr__,this,name,commandData,local_50,definition,
               *returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start,raii);
    break;
  case 2:
    generateCommandResultSingleSuccessWithErrors2Return
              (__return_storage_ptr__,this,name,commandData,local_50,definition,&returnParams,raii);
    break;
  case 3:
    generateCommandResultSingleSuccessWithErrors3Return
              (__return_storage_ptr__,this,name,commandData,local_50,definition,&returnParams,raii);
    break;
  default:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_51);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateCommandResultSingleSuccessWithErrors(
  std::string const & name, CommandData const & commandData, size_t initialSkipCount, bool definition, bool raii ) const
{
  std::vector<size_t> returnParams = determineReturnParams( commandData.params );
  switch ( returnParams.size() )
  {
    case 0 : return generateCommandResultWithErrors0Return( name, commandData, initialSkipCount, definition, raii );
    case 1 : return generateCommandResultSingleSuccessWithErrors1Return( name, commandData, initialSkipCount, definition, returnParams[0], raii );
    case 2 : return generateCommandResultSingleSuccessWithErrors2Return( name, commandData, initialSkipCount, definition, returnParams, raii );
    case 3 : return generateCommandResultSingleSuccessWithErrors3Return( name, commandData, initialSkipCount, definition, returnParams, raii );
    default: break;
  }
  return "";
}